

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall
QTextDocumentPrivate::adjustDocumentChangesAndCursors
          (QTextDocumentPrivate *this,int from,int addedOrRemoved,Operation op)

{
  int iVar1;
  undefined1 *puVar2;
  int iVar3;
  QTextCursorPrivate *this_00;
  ulong uVar4;
  AdjustResult AVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  Data *pDVar11;
  int iVar12;
  
  if (this->editBlock == 0) {
    this->revision = this->revision + 1;
  }
  if ((this->field_0x294 & 2) != 0) goto LAB_004d1114;
  pDVar11 = (this->cursors).q_hash.d;
  if (pDVar11 == (Data *)0x0) {
    pDVar11 = (Data *)0x0;
    uVar8 = 0;
LAB_004d1080:
    if (uVar8 == 0 && pDVar11 == (Data *)0x0) goto LAB_004d1114;
  }
  else {
    if (pDVar11->spans->offsets[0] == 0xff) {
      uVar4 = 1;
      do {
        uVar8 = uVar4;
        if (pDVar11->numBuckets == uVar8) {
          pDVar11 = (Data *)0x0;
          uVar8 = 0;
          break;
        }
        uVar4 = uVar8 + 1;
      } while (pDVar11->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
      goto LAB_004d1080;
    }
    uVar8 = 0;
  }
  do {
    this_00 = *(QTextCursorPrivate **)
               pDVar11->spans[uVar8 >> 7].entries
               [pDVar11->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f]].storage.data;
    AVar5 = QTextCursorPrivate::adjustPosition(this_00,from,addedOrRemoved,op);
    if (AVar5 == CursorMoved) {
      puVar2 = &this_00->field_0x28;
      *puVar2 = *puVar2 | 4;
    }
    do {
      if (pDVar11->numBuckets - 1 == uVar8) {
        uVar8 = 0;
        pDVar11 = (Data *)0x0;
        break;
      }
      uVar8 = uVar8 + 1;
    } while (pDVar11->spans[uVar8 >> 7].offsets[(uint)uVar8 & 0x7f] == 0xff);
  } while ((uVar8 != 0) || (pDVar11 != (Data *)0x0));
LAB_004d1114:
  iVar3 = this->docChangeFrom;
  if (iVar3 < 0) {
    this->docChangeFrom = from;
    if (addedOrRemoved < 1) {
      this->docChangeOldLength = -addedOrRemoved;
      this->docChangeLength = 0;
    }
    else {
      this->docChangeOldLength = 0;
      this->docChangeLength = addedOrRemoved;
    }
  }
  else {
    iVar6 = 0;
    if (0 < addedOrRemoved) {
      iVar6 = addedOrRemoved;
    }
    iVar12 = -addedOrRemoved;
    if (-1 < addedOrRemoved) {
      iVar12 = 0;
    }
    iVar1 = iVar12 + from;
    if (iVar3 - iVar1 == 0 || iVar3 < iVar1) {
      iVar7 = this->docChangeLength;
      iVar10 = iVar7 + iVar3;
      iVar9 = 0;
      if (from - iVar10 != 0 && iVar10 <= from) {
        iVar9 = from - iVar10;
      }
    }
    else {
      iVar7 = this->docChangeLength;
      iVar10 = iVar7 + iVar3;
      iVar9 = iVar3 - iVar1;
    }
    if (iVar1 < iVar10) {
      iVar10 = iVar1;
    }
    iVar1 = from;
    if (from < iVar3) {
      iVar1 = iVar3;
    }
    if (iVar3 < from) {
      from = iVar3;
    }
    iVar3 = 0;
    if (0 < iVar10 - iVar1) {
      iVar3 = iVar10 - iVar1;
    }
    this->docChangeFrom = from;
    this->docChangeOldLength = (iVar12 + iVar9 + this->docChangeOldLength) - iVar3;
    this->docChangeLength = (iVar6 + iVar7 + iVar9) - iVar3;
  }
  return;
}

Assistant:

void QTextDocumentPrivate::adjustDocumentChangesAndCursors(int from, int addedOrRemoved, QTextUndoCommand::Operation op)
{
    if (!editBlock)
        ++revision;

    if (blockCursorAdjustment)  {
        ; // postpone, will be called again from QTextDocumentPrivate::remove()
    } else {
        for (QTextCursorPrivate *curs : std::as_const(cursors)) {
            if (curs->adjustPosition(from, addedOrRemoved, op) == QTextCursorPrivate::CursorMoved) {
                curs->changed = true;
            }
        }
    }

//     qDebug("QTextDocumentPrivate::adjustDocumentChanges: from=%d,addedOrRemoved=%d", from, addedOrRemoved);
    if (docChangeFrom < 0) {
        docChangeFrom = from;
        if (addedOrRemoved > 0) {
            docChangeOldLength = 0;
            docChangeLength = addedOrRemoved;
        } else {
            docChangeOldLength = -addedOrRemoved;
            docChangeLength = 0;
        }
//         qDebug("adjustDocumentChanges:");
//         qDebug("    -> %d %d %d", docChangeFrom, docChangeOldLength, docChangeLength);
        return;
    }

    // have to merge the new change with the already existing one.
    int added = qMax(0, addedOrRemoved);
    int removed = qMax(0, -addedOrRemoved);

    int diff = 0;
    if (from + removed < docChangeFrom)
        diff = docChangeFrom - from - removed;
    else if (from > docChangeFrom + docChangeLength)
        diff = from - (docChangeFrom + docChangeLength);

    int overlap_start = qMax(from, docChangeFrom);
    int overlap_end = qMin(from + removed, docChangeFrom + docChangeLength);
    int removedInside = qMax(0, overlap_end - overlap_start);
    removed -= removedInside;

//     qDebug("adjustDocumentChanges: from=%d, addedOrRemoved=%d, diff=%d, removedInside=%d", from, addedOrRemoved, diff, removedInside);
    docChangeFrom = qMin(docChangeFrom, from);
    docChangeOldLength += removed + diff;
    docChangeLength += added - removedInside + diff;
//     qDebug("    -> %d %d %d", docChangeFrom, docChangeOldLength, docChangeLength);

}